

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_dump.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char *__src;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  undefined8 uVar5;
  FILE *pFVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  opj_image_t *image;
  opj_codestream_index_t *cstr_index;
  opj_codestream_info_v2_t *cstr_info;
  opj_option_t long_option [1];
  opj_dparameters_t parameters;
  int local_20e8;
  long local_20e0;
  int local_20d8;
  undefined8 local_20d0;
  int local_20c4;
  char *local_20c0;
  undefined8 local_20b8;
  undefined8 local_20b0;
  char local_20a8 [16];
  opj_option_t local_2098;
  undefined1 local_206c [8];
  char local_2064 [4096];
  char local_1064 [4096];
  uint local_64;
  undefined4 local_4c;
  byte local_34;
  
  local_20d0 = 0;
  local_20b0 = 0;
  local_20c0 = (char *)0x0;
  local_20b8 = 0;
  opj_set_default_decoder_parameters(local_206c);
  local_2098.flag = (int *)0x0;
  local_2098.val = 0x79;
  local_2098._28_4_ = 0;
  local_2098.name = "ImgDir";
  local_2098.has_arg = 1;
  local_2098._12_4_ = 0;
  builtin_strncpy(local_20a8,"i:o:f:hv",9);
  local_20e8 = 0x13;
  bVar1 = true;
  local_20c4 = argc;
  do {
    while (iVar2 = opj_getopt_long(argc,argv,local_20a8,&local_2098,0x20), pFVar6 = _stdout,
          __src = opj_optarg, 0x75 < iVar2) {
      if (iVar2 == 0x76) {
        local_4c = 1;
      }
      else {
        if (iVar2 != 0x79) goto switchD_0010593d_caseD_67;
        sVar4 = strlen(opj_optarg);
        local_20c0 = (char *)malloc(sVar4 + 1);
        if (local_20c0 == (char *)0x0) {
          return 1;
        }
        strcpy(local_20c0,__src);
        bVar1 = false;
      }
    }
    switch(iVar2) {
    case 0x66:
      local_20e8 = atoi(opj_optarg);
      break;
    case 0x68:
      uVar5 = opj_version();
      fprintf(pFVar6,
              "\nThis is the opj_dump utility from the OpenJPEG project.\nIt dumps JPEG 2000 codestream info to stdout or a given file.\nIt has been compiled against openjp2 library v%s.\n\n"
              ,uVar5);
      fwrite("Parameters:\n",0xc,1,_stdout);
      fwrite("-----------\n",0xc,1,_stdout);
      fputc(10,_stdout);
      fwrite("  -ImgDir <directory>\n",0x16,1,_stdout);
      fwrite("\tImage file Directory path \n",0x1c,1,_stdout);
      fwrite("  -i <compressed file>\n",0x17,1,_stdout);
      fwrite("    REQUIRED only if an Input image directory not specified\n",0x3c,1,_stdout);
      fwrite("    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n",0x48,1,
             _stdout);
      fwrite("    is identified based on its suffix.\n",0x27,1,_stdout);
      fwrite("  -o <output file>\n",0x13,1,_stdout);
      fwrite("    OPTIONAL\n",0xd,1,_stdout);
      fwrite("    Output file where file info will be dump.\n",0x2e,1,_stdout);
      fwrite("    By default it will be in the stdout.\n",0x29,1,_stdout);
      fwrite("  -v ",5,1,_stdout);
      fwrite("    OPTIONAL\n",0xd,1,_stdout);
      fwrite("    Enable informative messages\n",0x20,1,_stdout);
      fwrite("    By default verbose mode is off.\n",0x24,1,_stdout);
      fputc(10,_stdout);
      goto LAB_00105d5d;
    case 0x69:
      pFVar6 = fopen(opj_optarg,"rb");
      if (pFVar6 != (FILE *)0x0) {
        local_20d8 = 0;
        local_20e0 = 0;
        sVar4 = fread(&local_20e0,1,0xc,pFVar6);
        fclose(pFVar6);
        if (sVar4 == 0xc) {
          uVar3 = get_file_format(__src);
          uVar9 = 2;
          if (uVar3 != 2) {
            uVar10 = 1;
            if (((local_20d8 != 0xa870a0d || local_20e0 != 0x2020506a0c000000) &&
                ((int)local_20e0 != 0xa870a0d)) && (uVar10 = 0, (int)local_20e0 != 0x51ff4fff))
            goto LAB_00105f1f;
            uVar9 = uVar3;
            if (uVar10 != uVar3) {
              main_cold_2();
              uVar9 = uVar10;
            }
          }
          local_64 = uVar9;
          if (__src == (char *)0x0) {
            local_2064[0] = '\0';
LAB_00105f64:
            main_cold_3();
            goto LAB_00105d5d;
          }
          if (*__src == '\0') {
            uVar12 = 0;
          }
          else {
            uVar12 = 0;
            do {
              uVar11 = uVar12;
              uVar12 = uVar11 + 1;
              if (__src[uVar11 + 1] == '\0') break;
            } while (uVar11 < 0xfff);
            if (0xffe < uVar11) goto LAB_00105f64;
          }
          memcpy(local_2064,__src,uVar12);
          local_2064[uVar12] = '\0';
          argc = local_20c4;
          break;
        }
      }
LAB_00105f1f:
      local_64 = 0xffffffff;
      fprintf(_stderr,
              "[ERROR] Unknown input file format: %s \n        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n"
              ,__src);
      goto LAB_00105d5d;
    case 0x6f:
      if (opj_optarg == (char *)0x0) {
        local_1064[0] = '\0';
LAB_00105f52:
        main_cold_1();
LAB_00105d5d:
        if (local_20c0 != (char *)0x0) {
          free(local_20c0);
        }
        return 1;
      }
      if (*opj_optarg == '\0') {
        uVar12 = 0;
      }
      else {
        uVar12 = 0;
        do {
          uVar11 = uVar12;
          uVar12 = uVar11 + 1;
          if (opj_optarg[uVar11 + 1] == '\0') break;
        } while (uVar11 < 0xfff);
        if (0xffe < uVar11) goto LAB_00105f52;
      }
      memcpy(local_1064,opj_optarg,uVar12);
      local_1064[uVar12] = '\0';
      break;
    default:
      if (iVar2 == -1) {
        if (bVar1) {
          if (local_2064[0] != '\0') {
            if (local_1064[0] != '\0') {
              pFVar6 = fopen(local_1064,"w");
              if (pFVar6 == (FILE *)0x0) {
                fprintf(_stderr,"ERROR -> failed to open %s for writing\n",local_1064);
                return 1;
              }
            }
            fputc(10,_stderr);
            lVar7 = opj_stream_create_default_file_stream(local_2064,1);
            if (lVar7 == 0) {
              fprintf(_stderr,"ERROR -> failed to create the stream from the file %s\n",local_2064);
              return 1;
            }
            if ((ulong)local_64 < 3) {
              lVar8 = opj_create_decompress(*(undefined4 *)(&DAT_001120b8 + (ulong)local_64 * 4));
              opj_set_info_handler(lVar8,info_callback,0);
              opj_set_warning_handler(lVar8,warning_callback,0);
              opj_set_error_handler(lVar8,error_callback,0);
              local_34 = local_34 | 2;
              iVar2 = opj_setup_decoder(lVar8);
              if (iVar2 == 0) {
                main_cold_8();
                return 1;
              }
              iVar2 = opj_read_header(lVar7,lVar8,&local_20d0);
              if (iVar2 == 0) {
                main_cold_7();
                return 1;
              }
              opj_dump_codec(lVar8,local_20e8,pFVar6);
              local_20b0 = opj_get_cstr_info(lVar8);
              local_20b8 = opj_get_cstr_index(lVar8);
              opj_stream_destroy(lVar7);
              if (lVar8 != 0) {
                opj_destroy_codec(lVar8);
              }
              opj_image_destroy(local_20d0);
              opj_destroy_cstr_index(&local_20b8);
              opj_destroy_cstr_info(&local_20b0);
            }
            else {
              main_cold_6();
            }
            fclose(pFVar6);
            return 0;
          }
          main_cold_9();
        }
        else if (local_2064[0] == '\0') {
          main_cold_5();
        }
        else {
          main_cold_4();
        }
        goto LAB_00105d5d;
      }
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
switchD_0010593d_caseD_67:
      main_cold_10();
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    FILE *fout = NULL;

    opj_dparameters_t parameters;           /* Decompression parameters */
    opj_image_t* image = NULL;                  /* Image structure */
    opj_codec_t* l_codec = NULL;                /* Handle to a decompressor */
    opj_stream_t *l_stream = NULL;              /* Stream */
    opj_codestream_info_v2_t* cstr_info = NULL;
    opj_codestream_index_t* cstr_index = NULL;

    OPJ_INT32 num_images, imageno;
    img_fol_t img_fol;
    dircnt_t *dirptr = NULL;

    /* Set decoding parameters to default values */
    opj_set_default_decoder_parameters(&parameters);

    /* Initialize img_fol */
    memset(&img_fol, 0, sizeof(img_fol_t));
    img_fol.flag = OPJ_IMG_INFO | OPJ_J2K_MH_INFO | OPJ_J2K_MH_IND;

    /* Parse input and get user encoding parameters */
    if (parse_cmdline_decoder(argc, argv, &parameters, &img_fol) == 1) {
        if (img_fol.imgdirpath) {
            free(img_fol.imgdirpath);
        }

        return EXIT_FAILURE;
    }

    /* Initialize reading of directory */
    if (img_fol.set_imgdir == 1) {
        int it_image;
        num_images = get_num_images(img_fol.imgdirpath);

        dirptr = (dircnt_t*)malloc(sizeof(dircnt_t));
        if (!dirptr) {
            return EXIT_FAILURE;
        }
        dirptr->filename_buf = (char*)malloc((size_t)num_images * OPJ_PATH_LEN * sizeof(
                char)); /* Stores at max 10 image file names*/
        if (!dirptr->filename_buf) {
            free(dirptr);
            return EXIT_FAILURE;
        }
        dirptr->filename = (char**) malloc((size_t)num_images * sizeof(char*));

        if (!dirptr->filename) {
            goto fails;
        }

        for (it_image = 0; it_image < num_images; it_image++) {
            dirptr->filename[it_image] = dirptr->filename_buf + it_image * OPJ_PATH_LEN;
        }

        if (load_images(dirptr, img_fol.imgdirpath) == 1) {
            goto fails;
        }

        if (num_images == 0) {
            fprintf(stdout, "Folder is empty\n");
            goto fails;
        }
    } else {
        num_images = 1;
    }

    /* Try to open for writing the output file if necessary */
    if (parameters.outfile[0] != 0) {
        fout = fopen(parameters.outfile, "w");
        if (!fout) {
            fprintf(stderr, "ERROR -> failed to open %s for writing\n", parameters.outfile);
            goto fails;
        }
    } else {
        fout = stdout;
    }

    /* Read the header of each image one by one */
    for (imageno = 0; imageno < num_images ; imageno++) {

        fprintf(stderr, "\n");

        if (img_fol.set_imgdir == 1) {
            if (get_next_file(imageno, dirptr, &img_fol, &parameters)) {
                fprintf(stderr, "skipping file...\n");
                continue;
            }
        }

        /* Read the input file and put it in memory */
        /* ---------------------------------------- */

        l_stream = opj_stream_create_default_file_stream(parameters.infile, 1);
        if (!l_stream) {
            fprintf(stderr, "ERROR -> failed to create the stream from the file %s\n",
                    parameters.infile);
            goto fails;
        }

        /* Read the JPEG2000 stream */
        /* ------------------------ */

        switch (parameters.decod_format) {
        case J2K_CFMT: { /* JPEG-2000 codestream */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_J2K);
            break;
        }
        case JP2_CFMT: { /* JPEG 2000 compressed image data */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JP2);
            break;
        }
        case JPT_CFMT: { /* JPEG 2000, JPIP */
            /* Get a decoder handle */
            l_codec = opj_create_decompress(OPJ_CODEC_JPT);
            break;
        }
        default:
            fprintf(stderr, "skipping file..\n");
            opj_stream_destroy(l_stream);
            continue;
        }

        /* catch events using our callbacks and give a local context */
        opj_set_info_handler(l_codec, info_callback, 00);
        opj_set_warning_handler(l_codec, warning_callback, 00);
        opj_set_error_handler(l_codec, error_callback, 00);

        parameters.flags |= OPJ_DPARAMETERS_DUMP_FLAG;

        /* Setup the decoder decoding parameters using user parameters */
        if (!opj_setup_decoder(l_codec, &parameters)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to setup the decoder\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            fclose(fout);
            goto fails;
        }

        /* Read the main header of the codestream and if necessary the JP2 boxes*/
        if (! opj_read_header(l_stream, l_codec, &image)) {
            fprintf(stderr, "ERROR -> opj_dump: failed to read the header\n");
            opj_stream_destroy(l_stream);
            opj_destroy_codec(l_codec);
            opj_image_destroy(image);
            fclose(fout);
            goto fails;
        }

        opj_dump_codec(l_codec, img_fol.flag, fout);

        cstr_info = opj_get_cstr_info(l_codec);

        cstr_index = opj_get_cstr_index(l_codec);

        /* close the byte stream */
        opj_stream_destroy(l_stream);

        /* free remaining structures */
        if (l_codec) {
            opj_destroy_codec(l_codec);
        }

        /* destroy the image header */
        opj_image_destroy(image);

        /* destroy the codestream index */
        opj_destroy_cstr_index(&cstr_index);

        /* destroy the codestream info */
        opj_destroy_cstr_info(&cstr_info);

    }

    /* Close the output file */
    fclose(fout);

    return EXIT_SUCCESS;

fails:
    if (dirptr) {
        if (dirptr->filename) {
            free(dirptr->filename);
        }
        if (dirptr->filename_buf) {
            free(dirptr->filename_buf);
        }
        free(dirptr);
    }
    return EXIT_FAILURE;
}